

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice_p.h
# Opt level: O0

void __thiscall QInputDevicePrivate::setAvailableVirtualGeometry(QInputDevicePrivate *this,QRect a)

{
  long lVar1;
  bool bVar2;
  QFlags<QInputDevice::Capability> QVar3;
  QInputDevice *pQVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QInputDevice *q;
  QRect *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd8;
  QFlagsStorage<QInputDevice::Capability> c;
  
  c.i = (Int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::operator==(in_stack_ffffffffffffffc0,in_RDI);
  if (!bVar2) {
    in_RDI[0xc].x1 = (Representation)(int)in_RSI;
    in_RDI[0xc].y1 = (Representation)(int)((ulong)in_RSI >> 0x20);
    in_RDI[0xc].x2 = (Representation)(int)in_RDX;
    in_RDI[0xc].y2 = (Representation)(int)((ulong)in_RDX >> 0x20);
    QVar3 = QFlags<QInputDevice::Capability>::operator|
                      ((QFlags<QInputDevice::Capability> *)in_stack_ffffffffffffffc0,
                       (Capability)((ulong)in_RDI >> 0x20));
    setCapabilities((QInputDevicePrivate *)
                    CONCAT44(QVar3.super_QFlagsStorageHelper<QInputDevice::Capability,_4>.
                             super_QFlagsStorage<QInputDevice::Capability>.i,
                             in_stack_ffffffffffffffc8),(Capabilities)c.i);
    pQVar4 = q_func((QInputDevicePrivate *)in_RDI);
    QInputDevice::availableVirtualGeometryChanged((QRect *)pQVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void setAvailableVirtualGeometry(QRect a)
    {
        if (a == availableVirtualGeometry)
            return;

        availableVirtualGeometry = a;
        setCapabilities(capabilities | QInputDevice::Capability::NormalizedPosition);
        Q_Q(QInputDevice);
        Q_EMIT q->availableVirtualGeometryChanged(availableVirtualGeometry);
    }